

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

btScalar __thiscall
btClosestNotMeConvexResultCallback::addSingleResult
          (btClosestNotMeConvexResultCallback *this,LocalConvexResult *convexResult,
          bool normalInWorldSpace)

{
  bool bVar1;
  byte in_DL;
  long *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 relativeVelocity;
  btVector3 linVelB;
  btVector3 linVelA;
  btVector3 *this_00;
  undefined4 in_stack_ffffffffffffff78;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btVector3 local_68;
  btScalar local_58 [2];
  btScalar abStack_50 [2];
  btVector3 local_48;
  btVector3 local_38;
  byte local_19;
  long *local_18;
  btScalar local_4;
  
  local_19 = in_DL & 1;
  if (*in_RSI == *(long *)(in_RDI[5].m_floats + 2)) {
    local_4 = 1.0;
  }
  else {
    local_18 = in_RSI;
    bVar1 = btCollisionObject::hasContactResponse((btCollisionObject *)*in_RSI);
    if (bVar1) {
      btVector3::btVector3(&local_38);
      this_00 = &local_48;
      btVector3::btVector3(this_00);
      bVar3 = operator-(in_RDI,this_00);
      abStack_50 = bVar3.m_floats._8_8_;
      local_58 = bVar3.m_floats._0_8_;
      local_6c = 0.0;
      local_70 = 0.0;
      local_74 = 0.0;
      local_38.m_floats._0_8_ = local_58;
      local_38.m_floats._8_8_ = abStack_50;
      btVector3::btVector3(&local_68,&local_6c,&local_70,&local_74);
      local_48.m_floats[0] = local_68.m_floats[0];
      local_48.m_floats[1] = local_68.m_floats[1];
      local_48.m_floats[2] = local_68.m_floats[2];
      local_48.m_floats[3] = local_68.m_floats[3];
      bVar3 = operator-(in_RDI,this_00);
      bVar4 = bVar3.m_floats[0];
      bVar5 = bVar3.m_floats[1];
      bVar6 = bVar3.m_floats[2];
      bVar2 = btVector3::dot((btVector3 *)(local_18 + 2),(btVector3 *)&stack0xffffffffffffff7c);
      if (bVar2 < -in_RDI[6].m_floats[0]) {
        local_4 = btCollisionWorld::ClosestConvexResultCallback::addSingleResult
                            ((ClosestConvexResultCallback *)CONCAT44(bVar6,bVar5),
                             (LocalConvexResult *)CONCAT44(bVar4,in_stack_ffffffffffffff78),
                             SUB81((ulong)in_RDI >> 0x38,0));
      }
      else {
        local_4 = 1.0;
      }
    }
    else {
      local_4 = 1.0;
    }
  }
  return local_4;
}

Assistant:

virtual btScalar addSingleResult(btCollisionWorld::LocalConvexResult& convexResult,bool normalInWorldSpace)
	{
		if (convexResult.m_hitCollisionObject == m_me)
			return 1.0f;

		//ignore result if there is no contact response
		if(!convexResult.m_hitCollisionObject->hasContactResponse())
			return 1.0f;

		btVector3 linVelA,linVelB;
		linVelA = m_convexToWorld-m_convexFromWorld;
		linVelB = btVector3(0,0,0);//toB.getOrigin()-fromB.getOrigin();

		btVector3 relativeVelocity = (linVelA-linVelB);
		//don't report time of impact for motion away from the contact normal (or causes minor penetration)
		if (convexResult.m_hitNormalLocal.dot(relativeVelocity)>=-m_allowedPenetration)
			return 1.f;

		return ClosestConvexResultCallback::addSingleResult (convexResult, normalInWorldSpace);
	}